

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass
          (SupportVectorClassifier *this,int32_t value)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int tmp;
  
  this_00 = &this->numberofsupportvectorsperclass_;
  uVar1 = (this->numberofsupportvectorsperclass_).current_size_;
  uVar2 = (this->numberofsupportvectorsperclass_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<int>::Reserve(this_00,uVar2 + 1);
  }
  piVar3 = google::protobuf::RepeatedField<int>::elements(this_00);
  piVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass(int32_t value) {
  numberofsupportvectorsperclass_.Add(value);
}